

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitLocalPropInit
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,FuncInfo *funcInfo)

{
  Scope *scope;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  PropertyId PVar4;
  RegSlot RVar5;
  uint cacheId;
  undefined4 *puVar6;
  FuncInfo *this_00;
  FunctionBody *pFVar7;
  RegSlot RVar8;
  uint scopeIndex;
  RegSlot *pRVar9;
  ByteCodeGenerator *this_01;
  
  scope = sym->scope;
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if ((!bVar2) && (sym->scopeSlot != -1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x118d,
                       "(sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty)"
                       ,
                       "sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty"
                      );
    if (!bVar2) goto LAB_007fa094;
    *puVar6 = 0;
  }
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if (bVar2) {
    if ((scope->field_0x44 & 2) == 0) {
      this_01 = (ByteCodeGenerator *)sym;
      PVar4 = Symbol::EnsureScopeSlot(sym,this,funcInfo);
      pRVar9 = &scope->location;
      if ((*(ushort *)&scope->field_0x44 & 0x16) == 4) {
        pRVar9 = &funcInfo->frameSlotsRegister;
      }
      RVar5 = *pRVar9;
      OVar3 = GetStSlotOp(this_01,scope,-1,RVar5,false,funcInfo);
      if ((RVar5 == 0xffffffff) || (RVar5 != funcInfo->frameSlotsRegister)) {
        Js::ByteCodeWriter::SlotI2
                  (&this->m_writer,OVar3,rhsLocation,scope->innerScopeIndex,PVar4 + 2);
      }
      else {
        Js::ByteCodeWriter::SlotI1(&this->m_writer,OVar3,rhsLocation,PVar4 + 2);
      }
    }
    else {
      this_00 = TopFuncInfo(this);
      pFVar7 = FuncInfo::GetParsedFunctionBody(this_00);
      if (((pFVar7->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1195,
                           "(!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc())",
                           "!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc()");
        if (!bVar2) {
LAB_007fa094:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      PVar4 = Symbol::EnsurePosition(sym,this);
      if (scope->innerScopeIndex == 0xffffffff) {
        RVar5 = scope->location;
      }
      else {
        RVar5 = FuncInfo::InnerScopeToRegSlot(funcInfo,scope);
      }
      cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar5,PVar4,false,true);
      bVar2 = sym->isNonSimpleParameter;
      if (RVar5 == 0xffffffff) {
        OVar3 = InitFld;
        if (bVar2 != false) {
          OVar3 = InitLetFld;
        }
        scopeIndex = scope->innerScopeIndex;
        if (scopeIndex != 0xffffffff) {
          OVar3 = bVar2 | InitInnerFld;
        }
      }
      else {
        if (funcInfo->frameObjRegister == RVar5) {
          RVar8 = RVar5;
          OVar3 = InitLocalFld;
          if (bVar2 != false) {
            OVar3 = InitLocalLetFld;
          }
        }
        else {
          OVar3 = InitFld;
          if (bVar2 != false) {
            OVar3 = InitLetFld;
          }
          if (scope->innerScopeIndex != 0xffffffff) {
            OVar3 = bVar2 + InitInnerFld;
          }
          RVar8 = funcInfo->frameObjRegister;
        }
        if (RVar5 == RVar8) {
          Js::ByteCodeWriter::ElementP(&this->m_writer,OVar3,rhsLocation,cacheId,false,true);
          goto LAB_007fa04f;
        }
        scopeIndex = scope->innerScopeIndex;
      }
      if (scopeIndex == 0xffffffff) {
        Js::ByteCodeWriter::PatchableProperty
                  (&this->m_writer,OVar3,rhsLocation,scope->location,cacheId,false,true);
      }
      else {
        Js::ByteCodeWriter::ElementPIndexed(&this->m_writer,OVar3,rhsLocation,scopeIndex,cacheId);
      }
    }
  }
LAB_007fa04f:
  RVar5 = sym->location;
  if (RVar5 != rhsLocation && RVar5 != 0xffffffff) {
    Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,RVar5,rhsLocation);
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitLocalPropInit(Js::RegSlot rhsLocation, Symbol *sym, FuncInfo *funcInfo)
{
    Scope *scope = sym->GetScope();

    // Check consistency of sym->IsInSlot.
    Assert(sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty);

    // Arrived at the scope in which the property was defined.
    if (sym->NeedsSlotAlloc(this, funcInfo))
    {
        // The property is in memory rather than register. We'll have to load it from the slots.
        if (scope->GetIsObject())
        {
            Assert(!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc());
            Js::PropertyId propertyId = sym->EnsurePosition(this);
            Js::RegSlot objReg;
            if (scope->HasInnerScopeIndex())
            {
                objReg = funcInfo->InnerScopeToRegSlot(scope);
            }
            else
            {
                objReg = scope->GetLocation();
            }
            uint cacheId = funcInfo->FindOrAddInlineCacheId(objReg, propertyId, false, true);
            Js::OpCode op = this->GetInitFldOp(scope, objReg, funcInfo, sym->GetIsNonSimpleParameter());
            if (objReg != Js::Constants::NoRegister && objReg == funcInfo->frameObjRegister)
            {
                this->m_writer.ElementP(op, rhsLocation, cacheId);
            }
            else if (scope->HasInnerScopeIndex())
            {
                this->m_writer.ElementPIndexed(op, rhsLocation, scope->GetInnerScopeIndex(), cacheId);
            }
            else
            {
                this->m_writer.PatchableProperty(op, rhsLocation, scope->GetLocation(), cacheId);
            }
        }
        else
        {
            // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            Js::RegSlot slotReg = scope->GetCanMerge() ? funcInfo->frameSlotsRegister : scope->GetLocation();
            // Now store the property to its slot.
            Js::OpCode op = this->GetStSlotOp(scope, -1, slotReg, false, funcInfo);

            if (slotReg != Js::Constants::NoRegister && slotReg == funcInfo->frameSlotsRegister)
            {
                this->m_writer.SlotI1(op, rhsLocation, slot + Js::ScopeSlots::FirstSlotIndex);
            }
            else
            {
                this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(), slot + Js::ScopeSlots::FirstSlotIndex);
            }
        }
    }
    if (sym->GetLocation() != Js::Constants::NoRegister && rhsLocation != sym->GetLocation())
    {
        this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);
    }
}